

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

aiNode * __thiscall
Assimp::ColladaLoader::BuildHierarchy(ColladaLoader *this,ColladaParser *pParser,Node *pNode)

{
  Node *pNVar1;
  aiNode *paVar2;
  size_type sVar3;
  size_type sVar4;
  aiNode **ppaVar5;
  const_reference ppNVar6;
  reference ppNVar7;
  aiNode *paVar8;
  ulong local_c0;
  size_t a_1;
  size_t a;
  vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_> instances;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  string local_58;
  aiNode *local_28;
  aiNode *node;
  Node *pNode_local;
  ColladaParser *pParser_local;
  ColladaLoader *this_local;
  
  node = (aiNode *)pNode;
  pNode_local = (Node *)pParser;
  pParser_local = (ColladaParser *)this;
  paVar2 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar2);
  local_28 = paVar2;
  FindNameForNode_abi_cxx11_(&local_58,this,(Node *)node);
  aiString::Set((aiString *)paVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  ColladaParser::CalculateResultTransform
            ((aiMatrix4x4 *)
             &instances.
              super__Vector_base<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(ColladaParser *)pNode_local,
             (vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_> *)
             ((node->mName).data + 0x7c));
  (local_28->mTransformation).d1 = (float)(undefined4)local_68;
  (local_28->mTransformation).d2 = (float)local_68._4_4_;
  (local_28->mTransformation).d3 = (float)(undefined4)uStack_60;
  (local_28->mTransformation).d4 = (float)uStack_60._4_4_;
  (local_28->mTransformation).c1 = (float)(undefined4)local_78;
  (local_28->mTransformation).c2 = (float)local_78._4_4_;
  (local_28->mTransformation).c3 = (float)(undefined4)uStack_70;
  (local_28->mTransformation).c4 = (float)uStack_70._4_4_;
  (local_28->mTransformation).b1 = (float)(undefined4)local_88;
  (local_28->mTransformation).b2 = (float)local_88._4_4_;
  (local_28->mTransformation).b3 = (float)(undefined4)uStack_80;
  (local_28->mTransformation).b4 = (float)uStack_80._4_4_;
  *(pointer *)&local_28->mTransformation =
       instances.
       super__Vector_base<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_28->mTransformation).a3 = (float)(undefined4)uStack_90;
  (local_28->mTransformation).a4 = (float)uStack_90._4_4_;
  std::vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_>::vector
            ((vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_>
              *)&a);
  ResolveNodeInstances
            (this,(ColladaParser *)pNode_local,(Node *)node,
             (vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_>
              *)&a);
  sVar3 = std::vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>::size
                    ((vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_> *)
                     ((node->mName).data + 100));
  sVar4 = std::vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_>
          ::size((vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_>
                  *)&a);
  local_28->mNumChildren = (int)sVar3 + (int)sVar4;
  ppaVar5 = (aiNode **)operator_new__((ulong)local_28->mNumChildren << 3);
  local_28->mChildren = ppaVar5;
  a_1 = 0;
  while( true ) {
    sVar3 = std::vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>::size
                      ((vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_> *)
                       ((node->mName).data + 100));
    pNVar1 = pNode_local;
    if (sVar3 <= a_1) break;
    ppNVar6 = std::vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>::
              operator[]((vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                          *)((node->mName).data + 100),a_1);
    paVar2 = BuildHierarchy(this,(ColladaParser *)pNVar1,*ppNVar6);
    local_28->mChildren[a_1] = paVar2;
    local_28->mChildren[a_1]->mParent = local_28;
    a_1 = a_1 + 1;
  }
  local_c0 = 0;
  while( true ) {
    sVar3 = std::
            vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_>::
            size((vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_>
                  *)&a);
    pNVar1 = pNode_local;
    if (sVar3 <= local_c0) break;
    ppNVar7 = std::
              vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_>
              ::operator[]((vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_>
                            *)&a,local_c0);
    paVar8 = BuildHierarchy(this,(ColladaParser *)pNVar1,*ppNVar7);
    ppaVar5 = local_28->mChildren;
    sVar3 = std::vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>::size
                      ((vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_> *)
                       ((node->mName).data + 100));
    paVar2 = local_28;
    ppaVar5[sVar3 + local_c0] = paVar8;
    ppaVar5 = local_28->mChildren;
    sVar3 = std::vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>::size
                      ((vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_> *)
                       ((node->mName).data + 100));
    ppaVar5[sVar3 + local_c0]->mParent = paVar2;
    local_c0 = local_c0 + 1;
  }
  BuildMeshesForNode(this,(ColladaParser *)pNode_local,(Node *)node,local_28);
  BuildCamerasForNode(this,(ColladaParser *)pNode_local,(Node *)node,local_28);
  BuildLightsForNode(this,(ColladaParser *)pNode_local,(Node *)node,local_28);
  paVar2 = local_28;
  std::vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_>::
  ~vector((vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_> *)
          &a);
  return paVar2;
}

Assistant:

aiNode* ColladaLoader::BuildHierarchy(const ColladaParser& pParser, const Collada::Node* pNode) {
    // create a node for it
    aiNode* node = new aiNode();

    // find a name for the new node. It's more complicated than you might think
    node->mName.Set(FindNameForNode(pNode));

    // calculate the transformation matrix for it
    node->mTransformation = pParser.CalculateResultTransform(pNode->mTransforms);

    // now resolve node instances
    std::vector<const Collada::Node*> instances;
    ResolveNodeInstances(pParser, pNode, instances);

    // add children. first the *real* ones
    node->mNumChildren = static_cast<unsigned int>(pNode->mChildren.size() + instances.size());
    node->mChildren = new aiNode*[node->mNumChildren];

    for (size_t a = 0; a < pNode->mChildren.size(); ++a) {
        node->mChildren[a] = BuildHierarchy(pParser, pNode->mChildren[a]);
        node->mChildren[a]->mParent = node;
    }

    // ... and finally the resolved node instances
    for (size_t a = 0; a < instances.size(); ++a) {
        node->mChildren[pNode->mChildren.size() + a] = BuildHierarchy(pParser, instances[a]);
        node->mChildren[pNode->mChildren.size() + a]->mParent = node;
    }

    // construct meshes
    BuildMeshesForNode(pParser, pNode, node);

    // construct cameras
    BuildCamerasForNode(pParser, pNode, node);

    // construct lights
    BuildLightsForNode(pParser, pNode, node);

    return node;
}